

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_surjectionproof_allocate_initialized
              (secp256k1_context *ctx,secp256k1_surjectionproof **proof_out_p,size_t *input_index,
              secp256k1_fixed_asset_tag *fixed_input_tags,size_t n_input_tags,
              size_t n_input_tags_to_use,secp256k1_fixed_asset_tag *fixed_output_tag,
              size_t n_max_iterations,uchar *random_seed32)

{
  secp256k1_surjectionproof *proof_00;
  secp256k1_surjectionproof *proof;
  int ret;
  size_t n_input_tags_to_use_local;
  size_t n_input_tags_local;
  secp256k1_fixed_asset_tag *fixed_input_tags_local;
  size_t *input_index_local;
  secp256k1_surjectionproof **proof_out_p_local;
  secp256k1_context *ctx_local;
  
  proof._4_4_ = 0;
  if (proof_out_p == (secp256k1_surjectionproof **)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof_out_p != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    *proof_out_p = (secp256k1_surjectionproof *)0x0;
    proof_00 = (secp256k1_surjectionproof *)checked_malloc(&ctx->error_callback,0x2048);
    if (proof_00 != (secp256k1_surjectionproof *)0x0) {
      proof._4_4_ = secp256k1_surjectionproof_initialize
                              (ctx,proof_00,input_index,fixed_input_tags,n_input_tags,
                               n_input_tags_to_use,fixed_output_tag,n_max_iterations,random_seed32);
      if (proof._4_4_ == 0) {
        free(proof_00);
      }
      else {
        *proof_out_p = proof_00;
      }
    }
    ctx_local._4_4_ = proof._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_surjectionproof_allocate_initialized(const secp256k1_context* ctx, secp256k1_surjectionproof** proof_out_p, size_t *input_index, const secp256k1_fixed_asset_tag* fixed_input_tags, const size_t n_input_tags, const size_t n_input_tags_to_use, const secp256k1_fixed_asset_tag* fixed_output_tag, const size_t n_max_iterations, const unsigned char *random_seed32) {
    int ret = 0;
    secp256k1_surjectionproof* proof;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(proof_out_p != NULL);
    *proof_out_p = 0;

    proof = (secp256k1_surjectionproof*)checked_malloc(&ctx->error_callback, sizeof(secp256k1_surjectionproof));
    if (proof != NULL) {
        ret = secp256k1_surjectionproof_initialize(ctx, proof, input_index, fixed_input_tags, n_input_tags, n_input_tags_to_use, fixed_output_tag, n_max_iterations, random_seed32);
        if (ret) {
            *proof_out_p = proof;
        }
        else {
            free(proof);
        }
    }
    return ret;
}